

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::write_content_with_provider
          (ClientImpl *this,Stream *strm,Request *req,Error *error)

{
  type compressor_00;
  unique_ptr<httplib::detail::nocompressor,_std::default_delete<httplib::detail::nocompressor>_>
  local_48;
  unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
  local_40;
  unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
  compressor;
  anon_class_1_0_00000001 is_shutting_down;
  Error *error_local;
  Request *req_local;
  Stream *strm_local;
  ClientImpl *this_local;
  
  if ((req->is_chunked_content_provider_ & 1U) == 0) {
    this_local._7_1_ =
         detail::
         write_content<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_>
                   (strm,&req->content_provider_,0,req->content_length_,error);
  }
  else {
    std::unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>::
    unique_ptr<std::default_delete<httplib::detail::compressor>,void>
              ((unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
                *)&local_40);
    detail::make_unique<httplib::detail::nocompressor>();
    std::unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>::
    operator=((unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
               *)&local_40,&local_48);
    std::
    unique_ptr<httplib::detail::nocompressor,_std::default_delete<httplib::detail::nocompressor>_>::
    ~unique_ptr(&local_48);
    compressor_00 =
         std::
         unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
         ::operator*(&local_40);
    this_local._7_1_ =
         detail::
         write_content_chunked<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_,httplib::detail::compressor>
                   (strm,&req->content_provider_,
                    (anon_class_1_0_00000001 *)
                    ((long)&compressor._M_t.
                            super___uniq_ptr_impl<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::detail::compressor_*,_std::default_delete<httplib::detail::compressor>_>
                            .super__Head_base<0UL,_httplib::detail::compressor_*,_false>.
                            _M_head_impl + 7),compressor_00,error);
    std::unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
    ::~unique_ptr(&local_40);
  }
  return this_local._7_1_;
}

Assistant:

inline bool ClientImpl::write_content_with_provider(Stream &strm,
                                                    const Request &req,
                                                    Error &error) {
  auto is_shutting_down = []() { return false; };

  if (req.is_chunked_content_provider_) {
    // TODO: Brotli suport
    std::unique_ptr<detail::compressor> compressor;
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
    if (compress_) {
      compressor = detail::make_unique<detail::gzip_compressor>();
    } else
#endif
    {
      compressor = detail::make_unique<detail::nocompressor>();
    }

    return detail::write_content_chunked(strm, req.content_provider_,
                                         is_shutting_down, *compressor, error);
  } else {
    return detail::write_content(strm, req.content_provider_, 0,
                                 req.content_length_, is_shutting_down, error);
  }
}